

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf256.cpp
# Opt level: O0

bool gf256_self_test(void)

{
  byte bVar1;
  uint8_t uVar2;
  uint i_10;
  uint8_t expectedMul;
  uint i_9;
  uint i_8;
  uint8_t expectedMulAdd;
  uint i_7;
  uint i_6;
  uint i_5;
  uint i_4;
  uint i_3;
  uint i_2;
  uint i_1;
  uint8_t div2;
  uint8_t div1;
  uint8_t prod;
  uint j;
  uint i;
  int in_stack_0000005c;
  void *in_stack_00000060;
  void *in_stack_00000068;
  void *in_stack_00000070;
  int in_stack_000000e4;
  void *in_stack_000000e8;
  void *in_stack_000000f0;
  void *in_stack_000000f8;
  int in_stack_00000160;
  uint8_t in_stack_00000167;
  void *in_stack_00000168;
  void *in_stack_00000170;
  int in_stack_000001cc;
  void *in_stack_000001d0;
  void *in_stack_000001d8;
  int in_stack_000003b4;
  void *in_stack_000003b8;
  uint8_t in_stack_000003c7;
  void *in_stack_000003c8;
  uint local_48;
  uint local_40;
  uint local_3c;
  uint local_34;
  uint local_30;
  uint local_2c;
  uint local_28;
  uint local_24;
  uint local_20;
  uint local_1c;
  uint local_14;
  uint local_10;
  bool local_b;
  
  local_10 = 0;
  do {
    if (0xff < local_10) {
      m_SelfTestBuffers.A[0x3f] = 'Z';
      m_SelfTestBuffers.B[0x3f] = 'Z';
      m_SelfTestBuffers.C[0x3f] = 'Z';
      for (local_1c = 0; local_1c < 0x3f; local_1c = local_1c + 1) {
        m_SelfTestBuffers.A[local_1c] = '\x1f';
        m_SelfTestBuffers.B[local_1c] = 0xf7;
      }
      gf256_add_mem(in_stack_000001d8,in_stack_000001d0,in_stack_000001cc);
      for (local_20 = 0; local_20 < 0x3f; local_20 = local_20 + 1) {
        if (m_SelfTestBuffers.A[local_20] != 0xe8) {
          return false;
        }
      }
      for (local_24 = 0; local_24 < 0x3f; local_24 = local_24 + 1) {
        m_SelfTestBuffers.A[local_24] = '\x1f';
        m_SelfTestBuffers.B[local_24] = 0xf7;
        m_SelfTestBuffers.C[local_24] = 'q';
      }
      gf256_add2_mem(in_stack_00000070,in_stack_00000068,in_stack_00000060,in_stack_0000005c);
      for (local_28 = 0; local_28 < 0x3f; local_28 = local_28 + 1) {
        if (m_SelfTestBuffers.A[local_28] != 0x99) {
          return false;
        }
      }
      for (local_2c = 0; local_2c < 0x3f; local_2c = local_2c + 1) {
        m_SelfTestBuffers.A[local_2c] = 'U';
        m_SelfTestBuffers.B[local_2c] = 0xaa;
        m_SelfTestBuffers.C[local_2c] = 'l';
      }
      gf256_addset_mem(in_stack_000000f8,in_stack_000000f0,in_stack_000000e8,in_stack_000000e4);
      for (local_30 = 0; local_30 < 0x3f; local_30 = local_30 + 1) {
        if (m_SelfTestBuffers.A[local_30] != 0xc6) {
          return false;
        }
      }
      for (local_34 = 0; uVar2 = GF256Ctx.GF256_MUL_TABLE[0x6caa], local_34 < 0x3f;
          local_34 = local_34 + 1) {
        m_SelfTestBuffers.A[local_34] = 0xff;
        m_SelfTestBuffers.B[local_34] = 0xaa;
      }
      gf256_muladd_mem(in_stack_000003c8,in_stack_000003c7,in_stack_000003b8,in_stack_000003b4);
      for (local_3c = 0; local_3c < 0x3f; local_3c = local_3c + 1) {
        if (m_SelfTestBuffers.A[local_3c] != (uVar2 ^ 0xff)) {
          return false;
        }
      }
      for (local_40 = 0; uVar2 = GF256Ctx.GF256_MUL_TABLE[0x55a2], local_40 < 0x3f;
          local_40 = local_40 + 1) {
        m_SelfTestBuffers.A[local_40] = 0xff;
        m_SelfTestBuffers.B[local_40] = 'U';
      }
      gf256_mul_mem(in_stack_00000170,in_stack_00000168,in_stack_00000167,in_stack_00000160);
      local_48 = 0;
      while( true ) {
        if (0x3e < local_48) {
          if (m_SelfTestBuffers.A[0x3f] == 'Z') {
            if (m_SelfTestBuffers.B[0x3f] == 'Z') {
              if (m_SelfTestBuffers.C[0x3f] == 'Z') {
                local_b = true;
              }
              else {
                local_b = false;
              }
            }
            else {
              local_b = false;
            }
          }
          else {
            local_b = false;
          }
          return local_b;
        }
        if (m_SelfTestBuffers.A[local_48] != uVar2) break;
        local_48 = local_48 + 1;
      }
      return false;
    }
    for (local_14 = 0; local_14 < 0x100; local_14 = local_14 + 1) {
      bVar1 = GF256Ctx.GF256_MUL_TABLE[(local_14 & 0xff) * 0x100 + (local_10 & 0xff)];
      if ((local_10 == 0) || (local_14 == 0)) {
        if (bVar1 != 0) {
          return false;
        }
      }
      else {
        if (GF256Ctx.GF256_DIV_TABLE[(local_10 & 0xff) * 0x100 + (uint)bVar1] != local_14) {
          return false;
        }
        if (GF256Ctx.GF256_DIV_TABLE[(local_14 & 0xff) * 0x100 + (uint)bVar1] != local_10) {
          return false;
        }
      }
      if ((local_14 == 1) && (bVar1 != local_10)) {
        return false;
      }
    }
    local_10 = local_10 + 1;
  } while( true );
}

Assistant:

static bool gf256_self_test()
{
    if ((uintptr_t)m_SelfTestBuffers.A % GF256_ALIGN_BYTES != 0)
        return false;
    if ((uintptr_t)m_SelfTestBuffers.A % GF256_ALIGN_BYTES != 0)
        return false;
    if ((uintptr_t)m_SelfTestBuffers.B % GF256_ALIGN_BYTES != 0)
        return false;
    if ((uintptr_t)m_SelfTestBuffers.C % GF256_ALIGN_BYTES != 0)
        return false;

    // Check multiplication/division
    for (unsigned i = 0; i < 256; ++i)
    {
        for (unsigned j = 0; j < 256; ++j)
        {
            uint8_t prod = gf256_mul((uint8_t)i, (uint8_t)j);
            if (i != 0 && j != 0)
            {
                uint8_t div1 = gf256_div(prod, (uint8_t)i);
                if (div1 != j)
                    return false;
                uint8_t div2 = gf256_div(prod, (uint8_t)j);
                if (div2 != i)
                    return false;
            }
            else if (prod != 0)
                return false;
            if (j == 1 && prod != i)
                return false;
        }
    }

    // Check for overruns
    m_SelfTestBuffers.A[kTestBufferBytes] = 0x5a;
    m_SelfTestBuffers.B[kTestBufferBytes] = 0x5a;
    m_SelfTestBuffers.C[kTestBufferBytes] = 0x5a;

    // Test gf256_add_mem()
    for (unsigned i = 0; i < kTestBufferBytes; ++i)
    {
        m_SelfTestBuffers.A[i] = 0x1f;
        m_SelfTestBuffers.B[i] = 0xf7;
    }
    gf256_add_mem(m_SelfTestBuffers.A, m_SelfTestBuffers.B, kTestBufferBytes);
    for (unsigned i = 0; i < kTestBufferBytes; ++i)
        if (m_SelfTestBuffers.A[i] != (0x1f ^ 0xf7))
            return false;

    // Test gf256_add2_mem()
    for (unsigned i = 0; i < kTestBufferBytes; ++i)
    {
        m_SelfTestBuffers.A[i] = 0x1f;
        m_SelfTestBuffers.B[i] = 0xf7;
        m_SelfTestBuffers.C[i] = 0x71;
    }
    gf256_add2_mem(m_SelfTestBuffers.A, m_SelfTestBuffers.B, m_SelfTestBuffers.C, kTestBufferBytes);
    for (unsigned i = 0; i < kTestBufferBytes; ++i)
        if (m_SelfTestBuffers.A[i] != (0x1f ^ 0xf7 ^ 0x71))
            return false;

    // Test gf256_addset_mem()
    for (unsigned i = 0; i < kTestBufferBytes; ++i)
    {
        m_SelfTestBuffers.A[i] = 0x55;
        m_SelfTestBuffers.B[i] = 0xaa;
        m_SelfTestBuffers.C[i] = 0x6c;
    }
    gf256_addset_mem(m_SelfTestBuffers.A, m_SelfTestBuffers.B, m_SelfTestBuffers.C, kTestBufferBytes);
    for (unsigned i = 0; i < kTestBufferBytes; ++i)
        if (m_SelfTestBuffers.A[i] != (0xaa ^ 0x6c))
            return false;

    // Test gf256_muladd_mem()
    for (unsigned i = 0; i < kTestBufferBytes; ++i)
    {
        m_SelfTestBuffers.A[i] = 0xff;
        m_SelfTestBuffers.B[i] = 0xaa;
    }
    const uint8_t expectedMulAdd = gf256_mul(0xaa, 0x6c);
    gf256_muladd_mem(m_SelfTestBuffers.A, 0x6c, m_SelfTestBuffers.B, kTestBufferBytes);
    for (unsigned i = 0; i < kTestBufferBytes; ++i)
        if (m_SelfTestBuffers.A[i] != (expectedMulAdd ^ 0xff))
            return false;

    // Test gf256_mul_mem()
    for (unsigned i = 0; i < kTestBufferBytes; ++i)
    {
        m_SelfTestBuffers.A[i] = 0xff;
        m_SelfTestBuffers.B[i] = 0x55;
    }
    const uint8_t expectedMul = gf256_mul(0xa2, 0x55);
    gf256_mul_mem(m_SelfTestBuffers.A, m_SelfTestBuffers.B, 0xa2, kTestBufferBytes);
    for (unsigned i = 0; i < kTestBufferBytes; ++i)
        if (m_SelfTestBuffers.A[i] != expectedMul)
            return false;

    if (m_SelfTestBuffers.A[kTestBufferBytes] != 0x5a)
        return false;
    if (m_SelfTestBuffers.B[kTestBufferBytes] != 0x5a)
        return false;
    if (m_SelfTestBuffers.C[kTestBufferBytes] != 0x5a)
        return false;

    return true;
}